

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExportFileGenerator.cxx
# Opt level: O1

bool __thiscall
cmExportFileGenerator::PopulateInterfaceLinkLibrariesProperty
          (cmExportFileGenerator *this,cmGeneratorTarget *target,PreprocessContext preprocessRule,
          ImportPropertyMap *properties)

{
  string *prop;
  bool bVar1;
  int iVar2;
  cmValue input;
  mapped_type *pmVar3;
  long lVar4;
  string prepro;
  string local_50;
  
  bVar1 = cmGeneratorTarget::IsLinkable(target);
  if (bVar1) {
    if ((PopulateInterfaceLinkLibrariesProperty(cmGeneratorTarget_const*,cmGeneratorExpression::PreprocessContext,std::map<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>&)
         ::linkIfaceProps_abi_cxx11_ == '\0') &&
       (iVar2 = __cxa_guard_acquire(&PopulateInterfaceLinkLibrariesProperty(cmGeneratorTarget_const*,cmGeneratorExpression::PreprocessContext,std::map<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>&)
                                     ::linkIfaceProps_abi_cxx11_), iVar2 != 0)) {
      PopulateInterfaceLinkLibrariesProperty(cmGeneratorTarget_const*,cmGeneratorExpression::PreprocessContext,std::map<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>&)
      ::linkIfaceProps_abi_cxx11_._M_elems[0]._M_dataplus._M_p =
           (pointer)&PopulateInterfaceLinkLibrariesProperty(cmGeneratorTarget_const*,cmGeneratorExpression::PreprocessContext,std::map<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>&)
                     ::linkIfaceProps_abi_cxx11_._M_elems[0].field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)
                 &PopulateInterfaceLinkLibrariesProperty(cmGeneratorTarget_const*,cmGeneratorExpression::PreprocessContext,std::map<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>&)
                  ::linkIfaceProps_abi_cxx11_,"INTERFACE_LINK_LIBRARIES","");
      PopulateInterfaceLinkLibrariesProperty(cmGeneratorTarget_const*,cmGeneratorExpression::PreprocessContext,std::map<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>&)
      ::linkIfaceProps_abi_cxx11_._M_elems[1]._M_dataplus._M_p =
           (pointer)&PopulateInterfaceLinkLibrariesProperty(cmGeneratorTarget_const*,cmGeneratorExpression::PreprocessContext,std::map<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>&)
                     ::linkIfaceProps_abi_cxx11_._M_elems[1].field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)
                 (PopulateInterfaceLinkLibrariesProperty(cmGeneratorTarget_const*,cmGeneratorExpression::PreprocessContext,std::map<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>&)
                  ::linkIfaceProps_abi_cxx11_._M_elems + 1),"INTERFACE_LINK_LIBRARIES_DIRECT","");
      PopulateInterfaceLinkLibrariesProperty(cmGeneratorTarget_const*,cmGeneratorExpression::PreprocessContext,std::map<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>&)
      ::linkIfaceProps_abi_cxx11_._M_elems[2]._M_dataplus._M_p =
           (pointer)&PopulateInterfaceLinkLibrariesProperty(cmGeneratorTarget_const*,cmGeneratorExpression::PreprocessContext,std::map<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>&)
                     ::linkIfaceProps_abi_cxx11_._M_elems[2].field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)
                 (PopulateInterfaceLinkLibrariesProperty(cmGeneratorTarget_const*,cmGeneratorExpression::PreprocessContext,std::map<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>&)
                  ::linkIfaceProps_abi_cxx11_._M_elems + 2),
                 "INTERFACE_LINK_LIBRARIES_DIRECT_EXCLUDE","");
      __cxa_atexit(std::
                   array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>
                   ::~array,&PopulateInterfaceLinkLibrariesProperty(cmGeneratorTarget_const*,cmGeneratorExpression::PreprocessContext,std::map<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>&)
                             ::linkIfaceProps_abi_cxx11_,&__dso_handle);
      __cxa_guard_release(&PopulateInterfaceLinkLibrariesProperty(cmGeneratorTarget_const*,cmGeneratorExpression::PreprocessContext,std::map<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>&)
                           ::linkIfaceProps_abi_cxx11_);
    }
    lVar4 = 0;
    bVar1 = false;
    do {
      prop = (string *)
             ((long)&PopulateInterfaceLinkLibrariesProperty(cmGeneratorTarget_const*,cmGeneratorExpression::PreprocessContext,std::map<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>&)
                     ::linkIfaceProps_abi_cxx11_._M_elems[0]._M_dataplus._M_p + lVar4);
      input = cmGeneratorTarget::GetProperty(target,prop);
      if (input.Value != (string *)0x0) {
        cmGeneratorExpression::Preprocess(&local_50,input.Value,preprocessRule,false);
        if (local_50._M_string_length != 0) {
          ResolveTargetsInGeneratorExpressions(this,&local_50,target,ReplaceFreeTargets);
          pmVar3 = std::
                   map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   ::operator[](properties,prop);
          bVar1 = true;
          std::__cxx11::string::_M_assign((string *)pmVar3);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_50._M_dataplus._M_p != &local_50.field_2) {
          operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
        }
      }
      lVar4 = lVar4 + 0x20;
    } while (lVar4 != 0x60);
  }
  else {
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

bool cmExportFileGenerator::PopulateInterfaceLinkLibrariesProperty(
  cmGeneratorTarget const* target,
  cmGeneratorExpression::PreprocessContext preprocessRule,
  ImportPropertyMap& properties)
{
  if (!target->IsLinkable()) {
    return false;
  }
  static const std::array<std::string, 3> linkIfaceProps = {
    { "INTERFACE_LINK_LIBRARIES", "INTERFACE_LINK_LIBRARIES_DIRECT",
      "INTERFACE_LINK_LIBRARIES_DIRECT_EXCLUDE" }
  };
  bool hadINTERFACE_LINK_LIBRARIES = false;
  for (std::string const& linkIfaceProp : linkIfaceProps) {
    if (cmValue input = target->GetProperty(linkIfaceProp)) {
      std::string prepro =
        cmGeneratorExpression::Preprocess(*input, preprocessRule);
      if (!prepro.empty()) {
        this->ResolveTargetsInGeneratorExpressions(prepro, target,
                                                   ReplaceFreeTargets);
        properties[linkIfaceProp] = prepro;
        hadINTERFACE_LINK_LIBRARIES = true;
      }
    }
  }
  return hadINTERFACE_LINK_LIBRARIES;
}